

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# motion_search_facade.c
# Opt level: O2

int av1_joint_motion_search
              (AV1_COMP *cpi,MACROBLOCK *x,BLOCK_SIZE bsize,int_mv *cur_mv,uint8_t *mask,
              int mask_stride,int *rate_mv,int allow_second_mv,int joint_me_num_refine_iter)

{
  MACROBLOCKD *xd;
  buf_2d *pbVar1;
  MV mv;
  undefined8 *puVar2;
  byte bVar3;
  byte bVar4;
  char cVar5;
  bool bVar6;
  MB_MODE_INFO *pMVar7;
  MvCosts *mvjcost;
  YV12_BUFFER_CONFIG *src;
  int iVar8;
  uint8_t *puVar9;
  uint8_t *puVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  int iVar13;
  AV1_COMP *pAVar14;
  BLOCK_SIZE bsize_00;
  SEARCH_METHODS search_method;
  int_mv iVar15;
  FULLPEL_MV start_mv;
  int iVar16;
  int iVar17;
  int iVar18;
  ulong uVar19;
  buf_2d *pbVar20;
  ulong uVar21;
  search_site_config *search_sites;
  buf_2d *pbVar22;
  InterpFilterParams *pIVar23;
  long lVar24;
  buf_2d *pbVar25;
  undefined7 in_register_00000011;
  uint8_t *dst;
  InterpFilterParams *pIVar26;
  long lVar27;
  uint uVar28;
  MV *ref_mv_00;
  uint uVar29;
  int_mv *piVar30;
  uint uVar31;
  long lVar32;
  bool bVar33;
  bool bVar34;
  int_mv best_mv;
  int_mv second_best_mv;
  int_mv *local_84c0;
  int local_84b4;
  AV1_COMP *local_84b0;
  ulong local_84a8;
  int last_besterr [2];
  MV this_best_mv;
  uint sse;
  int dis;
  AV1_COMMON *local_8460;
  ulong local_8458;
  uint8_t *local_8450;
  ulong local_8448;
  ulong local_8440;
  ulong local_8438;
  undefined8 local_8430;
  YV12_BUFFER_CONFIG *scaled_ref_frame [2];
  int_mv ref_mv [2];
  buf_2d ref_yv12 [2];
  InterPredParams local_8368;
  FULLPEL_MV_STATS best_mv_stats;
  SUBPEL_MOTION_SEARCH_PARAMS ms_params;
  FULLPEL_MOTION_SEARCH_PARAMS full_ms_params;
  buf_2d backup_yv12 [2] [3];
  uint8_t second_pred16 [32768];
  
  local_8458 = CONCAT71(in_register_00000011,bsize);
  bVar33 = ((cpi->common).seq_params)->monochrome == '\0';
  bVar3 = block_size_wide[local_8458 & 0xffffffff];
  bVar4 = block_size_high[local_8458 & 0xffffffff];
  pMVar7 = *(x->e_mbd).mi;
  local_8430 = *(undefined8 *)cur_mv;
  cVar5 = pMVar7->ref_frame[1];
  mvjcost = x->mv_costs;
  iVar18 = (x->e_mbd).mi_row;
  local_8438 = (ulong)(uint)(x->e_mbd).mi_col;
  last_besterr[0] = 0x7fffffff;
  last_besterr[1] = 0x7fffffff;
  local_8440 = (ulong)(bVar33 + 1 + (uint)bVar33);
  local_8460 = &cpi->common;
  xd = &x->e_mbd;
  local_84c0 = cur_mv;
  local_84b4 = mask_stride;
  local_8450 = mask;
  scaled_ref_frame[0] = av1_get_scaled_ref_frame(cpi,(int)pMVar7->ref_frame[0]);
  scaled_ref_frame[1] = av1_get_scaled_ref_frame(cpi,(int)cVar5);
  dst = (uint8_t *)((ulong)second_pred16 >> 1);
  if ((((x->e_mbd).cur_buf)->flags & 8) == 0) {
    dst = second_pred16;
  }
  uVar31 = joint_me_num_refine_iter * 2;
  pbVar1 = (x->e_mbd).plane[0].pre;
  iVar8 = (int)local_8438;
  pIVar26 = av1_interp_4tap;
  pIVar23 = av1_interp_4tap;
  if ((0x10003UL >> (local_8458 & 0x3f) & 1) == 0) {
    pIVar23 = av1_interp_filter_params_list;
  }
  if ((0x20005UL >> (local_8458 & 0x3f) & 1) == 0) {
    pIVar26 = av1_interp_filter_params_list;
  }
  uVar28 = 0;
  if ((int)uVar31 < 1) {
    uVar31 = 0;
  }
  lVar32 = local_8440 * 0xa30;
  local_84b0 = cpi;
  for (; uVar28 != uVar31; uVar28 = uVar28 + 1) {
    uVar29 = uVar28 & 1;
    if ((1 < uVar28) &&
       (uVar19 = (ulong)((uVar29 ^ 1) << 2),
       *(int *)((long)local_84c0 + uVar19) == *(int *)((long)scaled_ref_frame + (uVar19 - 8)))) {
      iVar17 = *(int *)((long)local_84c0 + (ulong)(uVar29 * 4));
      iVar16 = *(int *)((long)scaled_ref_frame + ((ulong)(uVar29 * 4) - 8));
      if ((iVar17 == iVar16) ||
         (((uint)(int)(short)iVar17 >> 3 & 0xffff | (iVar17 >> 0x13) << 0x10) ==
          ((uint)(int)(short)iVar16 >> 3 & 0xffff | (iVar16 >> 0x13) << 0x10))) break;
    }
    pbVar22 = backup_yv12[0];
    pbVar25 = pbVar1;
    local_84a8 = (ulong)uVar29;
    for (lVar27 = 0; uVar19 = local_84a8, lVar27 != 2; lVar27 = lVar27 + 1) {
      iVar15 = av1_get_ref_mv(x,(int)lVar27);
      ref_mv[lVar27] = iVar15;
      src = scaled_ref_frame[lVar27];
      if (src != (YV12_BUFFER_CONFIG *)0x0) {
        pbVar20 = pbVar22;
        for (lVar24 = 0; lVar32 - lVar24 != 0; lVar24 = lVar24 + 0xa30) {
          puVar2 = (undefined8 *)((long)&pbVar25->buf + lVar24);
          puVar9 = (uint8_t *)*puVar2;
          puVar10 = (uint8_t *)puVar2[1];
          puVar2 = (undefined8 *)((long)&pbVar25->width + lVar24);
          uVar11 = *puVar2;
          uVar12 = puVar2[1];
          pbVar20->width = (int)uVar11;
          pbVar20->height = (int)((ulong)uVar11 >> 0x20);
          *(undefined8 *)&pbVar20->stride = uVar12;
          ((buf_2d *)&pbVar20->buf)->buf = puVar9;
          pbVar20->buf0 = puVar10;
          pbVar20 = pbVar20 + 1;
        }
        av1_setup_pre_planes
                  (xd,(int)lVar27,src,iVar18,(int)local_8438,(scale_factors *)0x0,(int)local_8440);
      }
      pbVar22 = pbVar22 + 3;
      pbVar25 = pbVar25 + 1;
    }
    ref_yv12[0].width = (x->e_mbd).plane[0].pre[0].width;
    ref_yv12[0].height = (x->e_mbd).plane[0].pre[0].height;
    ref_yv12[0].stride = (x->e_mbd).plane[0].pre[0].stride;
    ref_yv12[0]._28_4_ = *(undefined4 *)&(x->e_mbd).plane[0].pre[0].field_0x1c;
    ref_yv12[0].buf = pbVar1->buf;
    ref_yv12[0].buf0 = (x->e_mbd).plane[0].pre[0].buf0;
    ref_yv12[1].width = (x->e_mbd).plane[0].pre[1].width;
    ref_yv12[1].height = (x->e_mbd).plane[0].pre[1].height;
    ref_yv12[1].stride = (x->e_mbd).plane[0].pre[1].stride;
    ref_yv12[1]._28_4_ = *(undefined4 *)&(x->e_mbd).plane[0].pre[1].field_0x1c;
    ref_yv12[1].buf = (x->e_mbd).plane[0].pre[1].buf;
    ref_yv12[1].buf0 = (x->e_mbd).plane[0].pre[1].buf0;
    local_8368.bit_depth = (x->e_mbd).bd;
    uVar29 = (uint)local_84a8;
    local_8368.block_width = (uint)bVar3;
    local_8368.block_height = (uint)bVar4;
    local_8368.pix_row = iVar18 * 4;
    local_8368.pix_col = iVar8 * 4;
    local_8368.subsampling_x = 0;
    local_8368.subsampling_y = 0;
    local_8368.use_hbd_buf = (uint)((x->e_mbd).cur_buf)->flags >> 3 & 1;
    local_8368.is_intrabc = 0;
    local_8368.mode = TRANSLATION_PRED;
    local_8368.comp_mode = UNIFORM_SINGLE;
    uVar21 = (ulong)((uVar29 ^ 1) << 5);
    local_8368.top = -0x47000;
    local_8368.left = -0x47000;
    local_8368.interp_filter_params[0] = pIVar23;
    local_8368.interp_filter_params[1] = pIVar26;
    local_8368.scale_factors = &(cpi->common).sf_identity;
    local_8368.ref_frame_buf.buf = *(uint8_t **)((long)&ref_yv12[0].buf + uVar21);
    local_8368.ref_frame_buf.buf0 = *(uint8_t **)((long)&ref_yv12[0].buf0 + uVar21);
    local_8368.ref_frame_buf._16_8_ = *(undefined8 *)((long)&ref_yv12[0].width + uVar21);
    local_8368.ref_frame_buf._24_8_ = *(undefined8 *)((long)&ref_yv12[0].stride + uVar21);
    local_8368.conv_params.round_1 = 0x15 - local_8368.bit_depth;
    local_8368.conv_params.round_0 = local_8368.bit_depth + -7;
    if (local_8368.bit_depth < 0xb) {
      local_8368.conv_params.round_0 = 3;
      local_8368.conv_params.round_1 = 0xb;
    }
    local_8368.conv_params.do_average = 0;
    local_8368.conv_params.dst = (CONV_BUF_TYPE *)0x0;
    local_8368.conv_params.dst_stride = 0;
    local_8368.conv_params.plane = 0;
    local_8368.conv_params.is_compound = 0;
    local_8368.conv_params.use_dist_wtd_comp_avg = 0;
    av1_enc_build_one_inter_predictor(dst,(uint)bVar3,&local_84c0[uVar29 ^ 1].as_mv,&local_8368);
    if (uVar29 == 0) {
      uVar19 = 0;
    }
    else {
      uVar19 = uVar19 & 0xffffffff;
      uVar21 = (ulong)(uVar29 << 5);
      puVar9 = *(uint8_t **)((long)&ref_yv12[0].buf + uVar21);
      puVar10 = *(uint8_t **)((long)&ref_yv12[0].buf0 + uVar21);
      uVar11 = *(undefined8 *)((long)&ref_yv12[0].width + uVar21);
      uVar12 = *(undefined8 *)((long)&ref_yv12[0].stride + uVar21);
      (x->e_mbd).plane[0].pre[0].width = (int)uVar11;
      (x->e_mbd).plane[0].pre[0].height = (int)((ulong)uVar11 >> 0x20);
      *(undefined8 *)&(x->e_mbd).plane[0].pre[0].stride = uVar12;
      pbVar1->buf = puVar9;
      (x->e_mbd).plane[0].pre[0].buf0 = puVar10;
    }
    bsize_00 = (BLOCK_SIZE)local_8458;
    search_method = av1_get_default_mv_search_method(x,&(cpi->sf).mv_sf,(BLOCK_SIZE)local_8458);
    pAVar14 = local_84b0;
    search_sites = av1_get_search_site_config(local_84b0,x,search_method);
    uVar21 = (ulong)(uint)((int)uVar19 * 4);
    piVar30 = (int_mv *)((long)local_84c0 + uVar21);
    local_8448 = uVar19;
    start_mv = get_fullmv_from_mv(&piVar30->as_mv);
    ref_mv_00 = (MV *)((long)ref_mv + uVar21);
    av1_make_default_fullpel_ms_params
              (&full_ms_params,pAVar14,x,bsize_00,ref_mv_00,start_mv,search_sites,search_method,0);
    full_ms_params.ms_buffers.mask = local_8450;
    full_ms_params.ms_buffers.mask_stride = local_84b4;
    iVar17 = (int)local_84a8;
    full_ms_params.ms_buffers.second_pred = dst;
    full_ms_params.ms_buffers.inv_mask = iVar17;
    if (((pAVar14->sf).mv_sf.disable_extensive_joint_motion_search == 0) &&
       ((pMVar7->interinter_comp).type != '\x02')) {
      iVar16 = av1_full_pixel_search
                         (start_mv,&full_ms_params,5,(int *)0x0,&best_mv.as_fullmv,&best_mv_stats,
                          &second_best_mv.as_fullmv);
    }
    else {
      iVar16 = av1_refining_search_8p_c(&full_ms_params,start_mv,&best_mv.as_fullmv);
      second_best_mv = best_mv;
    }
    bVar33 = second_best_mv.as_int != 0x80008000;
    bVar34 = second_best_mv.as_int != best_mv.as_int;
    if (iVar17 != 0) {
      (x->e_mbd).plane[0].pre[0].width = ref_yv12[0].width;
      (x->e_mbd).plane[0].pre[0].height = ref_yv12[0].height;
      (x->e_mbd).plane[0].pre[0].stride = ref_yv12[0].stride;
      *(undefined4 *)&(x->e_mbd).plane[0].pre[0].field_0x1c = ref_yv12[0]._28_4_;
      pbVar1->buf = ref_yv12[0].buf;
      (x->e_mbd).plane[0].pre[0].buf0 = ref_yv12[0].buf0;
    }
    pbVar22 = backup_yv12[0];
    pbVar25 = pbVar1;
    for (lVar27 = 0; lVar27 != 2; lVar27 = lVar27 + 1) {
      if (scaled_ref_frame[lVar27] != (YV12_BUFFER_CONFIG *)0x0) {
        pbVar20 = pbVar22;
        for (lVar24 = 0; lVar32 - lVar24 != 0; lVar24 = lVar24 + 0xa30) {
          puVar9 = ((buf_2d *)&pbVar20->buf)->buf;
          puVar10 = pbVar20->buf0;
          uVar11 = *(undefined8 *)&pbVar20->stride;
          puVar2 = (undefined8 *)((long)&pbVar25->width + lVar24);
          *puVar2 = *(undefined8 *)&pbVar20->width;
          puVar2[1] = uVar11;
          puVar2 = (undefined8 *)((long)&pbVar25->buf + lVar24);
          *puVar2 = puVar9;
          puVar2[1] = puVar10;
          pbVar20 = pbVar20 + 1;
        }
        puVar9 = pbVar1[lVar27].buf;
        puVar10 = pbVar1[lVar27].buf0;
        pbVar20 = (x->e_mbd).plane[0].pre + lVar27;
        iVar13 = pbVar20->height;
        uVar11 = *(undefined8 *)(&pbVar20->width + 2);
        ref_yv12[lVar27].width = pbVar20->width;
        ref_yv12[lVar27].height = iVar13;
        *(undefined8 *)&ref_yv12[lVar27].stride = uVar11;
        ref_yv12[lVar27].buf = puVar9;
        ref_yv12[lVar27].buf0 = puVar10;
      }
      pbVar25 = pbVar25 + 1;
      pbVar22 = pbVar22 + 3;
    }
    if (iVar17 != 0) {
      uVar19 = (ulong)(uint)((int)local_8448 << 5);
      puVar9 = *(uint8_t **)((long)&ref_yv12[0].buf + uVar19);
      puVar10 = *(uint8_t **)((long)&ref_yv12[0].buf0 + uVar19);
      uVar11 = *(undefined8 *)((long)&ref_yv12[0].width + uVar19);
      uVar12 = *(undefined8 *)((long)&ref_yv12[0].stride + uVar19);
      (x->e_mbd).plane[0].pre[0].width = (int)uVar11;
      (x->e_mbd).plane[0].pre[0].height = (int)((ulong)uVar11 >> 0x20);
      *(undefined8 *)&(x->e_mbd).plane[0].pre[0].stride = uVar12;
      pbVar1->buf = puVar9;
      (x->e_mbd).plane[0].pre[0].buf0 = puVar10;
    }
    bVar6 = (local_84b0->common).features.cur_frame_force_integer_mv;
    if (bVar6 == true) {
      convert_fullmv_to_mv(&best_mv);
    }
    pAVar14 = local_84b0;
    iVar17 = 0x7fffffff;
    if ((iVar16 != 0x7fffffff) && (iVar17 = iVar16, bVar6 == false)) {
      av1_make_default_subpel_ms_params(&ms_params,local_84b0,x,bsize_00,ref_mv_00,(int *)0x0);
      ms_params.var_params.ms_buffers.mask = local_8450;
      ms_params.var_params.ms_buffers.mask_stride = local_84b4;
      ms_params.var_params.ms_buffers.inv_mask = (int)local_84a8;
      ms_params.forced_stop = '\0';
      ms_params.var_params.ms_buffers.second_pred = dst;
      iVar17 = (*(pAVar14->mv_search_params).find_fractional_mv_step)
                         (xd,local_8460,&ms_params,
                          (MV)((best_mv.as_int >> 0x10) * 0x80000 + (best_mv.as_int & 0x1fff) * 8),
                          (FULLPEL_MV_STATS *)0x0,(MV *)&best_mv,&dis,&sse,(int_mv *)0x0);
      if (allow_second_mv != 0 && (bVar33 && bVar34)) {
        mv = (MV)((second_best_mv.as_int >> 0x10) * 0x80000 + (second_best_mv.as_int & 0x1fff) * 8);
        iVar16 = av1_is_subpelmv_in_range(&ms_params.mv_limits,mv);
        if ((iVar16 != 0) &&
           (iVar16 = (*(local_84b0->mv_search_params).find_fractional_mv_step)
                               (xd,local_8460,&ms_params,mv,(FULLPEL_MV_STATS *)0x0,&this_best_mv,
                                &dis,&sse,(int_mv *)0x0), iVar16 < iVar17)) {
          best_mv.as_mv = this_best_mv;
          iVar17 = iVar16;
        }
      }
    }
    if ((int)local_84a8 != 0) {
      (x->e_mbd).plane[0].pre[0].width = ref_yv12[0].width;
      (x->e_mbd).plane[0].pre[0].height = ref_yv12[0].height;
      (x->e_mbd).plane[0].pre[0].stride = ref_yv12[0].stride;
      *(undefined4 *)&(x->e_mbd).plane[0].pre[0].field_0x1c = ref_yv12[0]._28_4_;
      pbVar1->buf = ref_yv12[0].buf;
      (x->e_mbd).plane[0].pre[0].buf0 = ref_yv12[0].buf0;
    }
    if (last_besterr[local_8448] <= iVar17) break;
    *piVar30 = best_mv;
    last_besterr[local_8448] = iVar17;
  }
  *rate_mv = 0;
  piVar30 = local_84c0;
  for (lVar32 = 0; lVar32 != 2; lVar32 = lVar32 + 1) {
    full_ms_params._0_4_ = av1_get_ref_mv(x,(int)lVar32);
    iVar18 = av1_mv_bit_cost(&piVar30->as_mv,(MV *)&full_ms_params,mvjcost->nmv_joint_cost,
                             mvjcost->mv_cost_stack,0x6c);
    *rate_mv = *rate_mv + iVar18;
    piVar30 = piVar30 + 1;
  }
  if (last_besterr[0] < last_besterr[1]) {
    last_besterr[1] = last_besterr[0];
  }
  return last_besterr[1];
}

Assistant:

int av1_joint_motion_search(const AV1_COMP *cpi, MACROBLOCK *x,
                            BLOCK_SIZE bsize, int_mv *cur_mv,
                            const uint8_t *mask, int mask_stride, int *rate_mv,
                            int allow_second_mv, int joint_me_num_refine_iter) {
  const AV1_COMMON *const cm = &cpi->common;
  const int num_planes = av1_num_planes(cm);
  const int pw = block_size_wide[bsize];
  const int ph = block_size_high[bsize];
  const int plane = 0;
  MACROBLOCKD *xd = &x->e_mbd;
  MB_MODE_INFO *mbmi = xd->mi[0];
  // This function should only ever be called for compound modes
  assert(has_second_ref(mbmi));
  const int_mv init_mv[2] = { cur_mv[0], cur_mv[1] };
  const int refs[2] = { mbmi->ref_frame[0], mbmi->ref_frame[1] };
  const MvCosts *mv_costs = x->mv_costs;
  int_mv ref_mv[2];
  int ite, ref;

  // Get the prediction block from the 'other' reference frame.
  const int_interpfilters interp_filters =
      av1_broadcast_interp_filter(EIGHTTAP_REGULAR);

  InterPredParams inter_pred_params;
  const int mi_row = xd->mi_row;
  const int mi_col = xd->mi_col;

  // Do joint motion search in compound mode to get more accurate mv.
  struct buf_2d backup_yv12[2][MAX_MB_PLANE];
  int last_besterr[2] = { INT_MAX, INT_MAX };
  const YV12_BUFFER_CONFIG *const scaled_ref_frame[2] = {
    av1_get_scaled_ref_frame(cpi, refs[0]),
    av1_get_scaled_ref_frame(cpi, refs[1])
  };

  // Prediction buffer from second frame.
  DECLARE_ALIGNED(16, uint8_t, second_pred16[MAX_SB_SQUARE * sizeof(uint16_t)]);
  uint8_t *second_pred = get_buf_by_bd(xd, second_pred16);

  int_mv best_mv, second_best_mv;

  // Allow joint search multiple times iteratively for each reference frame
  // and break out of the search loop if it couldn't find a better mv.
  for (ite = 0; ite < (2 * joint_me_num_refine_iter); ite++) {
    struct buf_2d ref_yv12[2];
    int bestsme = INT_MAX;
    int id = ite % 2;  // Even iterations search in the first reference frame,
                       // odd iterations search in the second. The predictor
                       // found for the 'other' reference frame is factored in.
    if (ite >= 2 && cur_mv[!id].as_int == init_mv[!id].as_int) {
      if (cur_mv[id].as_int == init_mv[id].as_int) {
        break;
      } else {
        int_mv cur_int_mv, init_int_mv;
        cur_int_mv.as_mv.col = cur_mv[id].as_mv.col >> 3;
        cur_int_mv.as_mv.row = cur_mv[id].as_mv.row >> 3;
        init_int_mv.as_mv.row = init_mv[id].as_mv.row >> 3;
        init_int_mv.as_mv.col = init_mv[id].as_mv.col >> 3;
        if (cur_int_mv.as_int == init_int_mv.as_int) {
          break;
        }
      }
    }
    for (ref = 0; ref < 2; ++ref) {
      ref_mv[ref] = av1_get_ref_mv(x, ref);
      // Swap out the reference frame for a version that's been scaled to
      // match the resolution of the current frame, allowing the existing
      // motion search code to be used without additional modifications.
      if (scaled_ref_frame[ref]) {
        int i;
        for (i = 0; i < num_planes; i++)
          backup_yv12[ref][i] = xd->plane[i].pre[ref];
        av1_setup_pre_planes(xd, ref, scaled_ref_frame[ref], mi_row, mi_col,
                             NULL, num_planes);
      }
    }

    assert(IMPLIES(scaled_ref_frame[0] != NULL,
                   cm->width == scaled_ref_frame[0]->y_crop_width &&
                       cm->height == scaled_ref_frame[0]->y_crop_height));
    assert(IMPLIES(scaled_ref_frame[1] != NULL,
                   cm->width == scaled_ref_frame[1]->y_crop_width &&
                       cm->height == scaled_ref_frame[1]->y_crop_height));

    // Initialize based on (possibly scaled) prediction buffers.
    ref_yv12[0] = xd->plane[plane].pre[0];
    ref_yv12[1] = xd->plane[plane].pre[1];

    av1_init_inter_params(&inter_pred_params, pw, ph, mi_row * MI_SIZE,
                          mi_col * MI_SIZE, 0, 0, xd->bd, is_cur_buf_hbd(xd), 0,
                          &cm->sf_identity, &ref_yv12[!id], interp_filters);
    inter_pred_params.conv_params = get_conv_params(0, 0, xd->bd);

    // Since we have scaled the reference frames to match the size of the
    // current frame we must use a unit scaling factor during mode selection.
    av1_enc_build_one_inter_predictor(second_pred, pw, &cur_mv[!id].as_mv,
                                      &inter_pred_params);

    // Do full-pixel compound motion search on the current reference frame.
    if (id) xd->plane[plane].pre[0] = ref_yv12[id];

    // Make motion search params
    FULLPEL_MOTION_SEARCH_PARAMS full_ms_params;
    FULLPEL_MV_STATS best_mv_stats;
    const MV_SPEED_FEATURES *mv_sf = &cpi->sf.mv_sf;
    const SEARCH_METHODS search_method =
        av1_get_default_mv_search_method(x, mv_sf, bsize);
    const search_site_config *src_search_sites =
        av1_get_search_site_config(cpi, x, search_method);
    // Use the mv result from the single mode as mv predictor.
    const FULLPEL_MV start_fullmv = get_fullmv_from_mv(&cur_mv[id].as_mv);
    av1_make_default_fullpel_ms_params(&full_ms_params, cpi, x, bsize,
                                       &ref_mv[id].as_mv, start_fullmv,
                                       src_search_sites, search_method,
                                       /*fine_search_interval=*/0);

    av1_set_ms_compound_refs(&full_ms_params.ms_buffers, second_pred, mask,
                             mask_stride, id);

    // Small-range full-pixel motion search.
    if (!mv_sf->disable_extensive_joint_motion_search &&
        mbmi->interinter_comp.type != COMPOUND_WEDGE) {
      bestsme = av1_full_pixel_search(start_fullmv, &full_ms_params, 5, NULL,
                                      &best_mv.as_fullmv, &best_mv_stats,
                                      &second_best_mv.as_fullmv);
    } else {
      bestsme = av1_refining_search_8p_c(&full_ms_params, start_fullmv,
                                         &best_mv.as_fullmv);
      second_best_mv = best_mv;
    }

    const int try_second = second_best_mv.as_int != INVALID_MV &&
                           second_best_mv.as_int != best_mv.as_int &&
                           allow_second_mv;

    // Restore the pointer to the first (possibly scaled) prediction buffer.
    if (id) xd->plane[plane].pre[0] = ref_yv12[0];

    for (ref = 0; ref < 2; ++ref) {
      if (scaled_ref_frame[ref]) {
        // Swap back the original buffers for subpel motion search.
        for (int i = 0; i < num_planes; i++) {
          xd->plane[i].pre[ref] = backup_yv12[ref][i];
        }
        // Re-initialize based on unscaled prediction buffers.
        ref_yv12[ref] = xd->plane[plane].pre[ref];
      }
    }

    // Do sub-pixel compound motion search on the current reference frame.
    if (id) xd->plane[plane].pre[0] = ref_yv12[id];

    if (cpi->common.features.cur_frame_force_integer_mv) {
      convert_fullmv_to_mv(&best_mv);
    }
    if (bestsme < INT_MAX &&
        cpi->common.features.cur_frame_force_integer_mv == 0) {
      int dis; /* TODO: use dis in distortion calculation later. */
      unsigned int sse;
      SUBPEL_MOTION_SEARCH_PARAMS ms_params;
      av1_make_default_subpel_ms_params(&ms_params, cpi, x, bsize,
                                        &ref_mv[id].as_mv, NULL);
      av1_set_ms_compound_refs(&ms_params.var_params.ms_buffers, second_pred,
                               mask, mask_stride, id);
      ms_params.forced_stop = EIGHTH_PEL;
      MV start_mv = get_mv_from_fullmv(&best_mv.as_fullmv);
      assert(av1_is_subpelmv_in_range(&ms_params.mv_limits, start_mv));
      bestsme = cpi->mv_search_params.find_fractional_mv_step(
          xd, cm, &ms_params, start_mv, NULL, &best_mv.as_mv, &dis, &sse, NULL);

      if (try_second) {
        MV this_best_mv;
        MV subpel_start_mv = get_mv_from_fullmv(&second_best_mv.as_fullmv);
        if (av1_is_subpelmv_in_range(&ms_params.mv_limits, subpel_start_mv)) {
          const int thissme = cpi->mv_search_params.find_fractional_mv_step(
              xd, cm, &ms_params, subpel_start_mv, NULL, &this_best_mv, &dis,
              &sse, NULL);
          if (thissme < bestsme) {
            best_mv.as_mv = this_best_mv;
            bestsme = thissme;
          }
        }
      }
    }

    // Restore the pointer to the first prediction buffer.
    if (id) xd->plane[plane].pre[0] = ref_yv12[0];
    if (bestsme < last_besterr[id]) {
      cur_mv[id] = best_mv;
      last_besterr[id] = bestsme;
    } else {
      break;
    }
  }

  *rate_mv = 0;

  for (ref = 0; ref < 2; ++ref) {
    const int_mv curr_ref_mv = av1_get_ref_mv(x, ref);
    *rate_mv += av1_mv_bit_cost(&cur_mv[ref].as_mv, &curr_ref_mv.as_mv,
                                mv_costs->nmv_joint_cost,
                                mv_costs->mv_cost_stack, MV_COST_WEIGHT);
  }

  return AOMMIN(last_besterr[0], last_besterr[1]);
}